

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_reader.cpp
# Opt level: O2

int __thiscall argo::fd_reader::read_next_char(fd_reader *this)

{
  int iVar1;
  ssize_t sVar2;
  json_io_exception *this_00;
  int *piVar3;
  char buf [1];
  
  sVar2 = read(*(int *)&(this->super_reader).field_0x202c,buf,1);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == -1) {
        this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
        piVar3 = __errno_location();
        json_io_exception::json_io_exception(this_00,read_failed_e,*piVar3);
      }
      else {
        this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
        json_io_exception::json_io_exception(this_00,unexpected_result_from_read_e);
      }
      __cxa_throw(this_00,&json_io_exception::typeinfo,std::exception::~exception);
    }
    iVar1 = (int)buf[0];
  }
  return iVar1;
}

Assistant:

int fd_reader::read_next_char()
{
    char buf[1];
    int n = read(m_fd, buf, 1);

    if (n == 0)
    {
        return EOF;
    }
    else if (n == 1)
    {
        return buf[0];
    }
    else if (n == -1)
    {
        throw json_io_exception(json_io_exception::read_failed_e, errno);
    }
    else
    {
        throw json_io_exception(json_io_exception::unexpected_result_from_read_e);
    }
}